

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O0

AST * parse_conditional_expression(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  AST *center;
  Map *pMVar2;
  AST *hold;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  translation_data_local = (Translation_Data *)parse_logical_or_expression(translation_data,scope);
  cVar1 = get_and_check(translation_data,KW_QUESTION);
  if (cVar1 != '\0') {
    center = parse_expression(translation_data,scope);
    translation_data_local =
         (Translation_Data *)
         get_conditional_expression_tree((AST *)translation_data_local,center,(AST *)0x0);
    cVar1 = get_and_check(translation_data,KW_COLUMN);
    if (cVar1 == '\0') {
      push_translation_error("expected \':\' here",translation_data);
      translation_data_local = (Translation_Data *)get_error_tree((AST *)translation_data_local);
    }
    else {
      pMVar2 = (Map *)parse_conditional_expression(translation_data,scope);
      translation_data_local->macros = pMVar2;
    }
  }
  return (AST *)translation_data_local;
}

Assistant:

struct AST* parse_conditional_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	
	struct AST *hold;
	hold=parse_logical_or_expression(translation_data,scope);
	if(get_and_check(translation_data,KW_QUESTION))
	{
		hold=(struct AST*)get_conditional_expression_tree(hold,parse_expression(translation_data,scope),NULL);
		if(get_and_check(translation_data,KW_COLUMN))
		{
			((struct AST_Conditional_Expression*)hold)->right=parse_conditional_expression(translation_data,scope);
			return hold;
		}else
		{
			push_translation_error("expected ':' here",translation_data);
			return (struct AST*)get_error_tree(hold);
		}
	}else
	{
		return hold;
	}
}